

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O0

iterator * __thiscall
so_5::impl::local_mbox_details::subscriber_adaptive_container_t::find_in_vector
          (iterator *__return_storage_ptr__,subscriber_adaptive_container_t *this,agent_t *agent)

{
  bool bVar1;
  pointer this_00;
  agent_t *paVar2;
  iterator it_v;
  bool bVar3;
  __normal_iterator<so_5::impl::local_mbox_details::subscriber_info_t_*,_std::vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  local_58;
  subscriber_info_t *local_50;
  __normal_iterator<so_5::impl::local_mbox_details::subscriber_info_t_*,_std::vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  local_48;
  __normal_iterator<so_5::impl::local_mbox_details::subscriber_info_t_*,_std::vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  local_40;
  __normal_iterator<so_5::impl::local_mbox_details::subscriber_info_t_*,_std::vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  pos;
  subscriber_info_t info;
  agent_t *agent_local;
  subscriber_adaptive_container_t *this_local;
  
  subscriber_info_t::subscriber_info_t((subscriber_info_t *)&pos,agent);
  local_48._M_current =
       (subscriber_info_t *)
       std::
       vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
       ::begin(&this->m_vector);
  local_50 = (subscriber_info_t *)
             std::
             vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
             ::end(&this->m_vector);
  local_40 = std::
             lower_bound<__gnu_cxx::__normal_iterator<so_5::impl::local_mbox_details::subscriber_info_t*,std::vector<so_5::impl::local_mbox_details::subscriber_info_t,std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>>>,so_5::impl::local_mbox_details::subscriber_info_t>
                       (local_48,(__normal_iterator<so_5::impl::local_mbox_details::subscriber_info_t_*,_std::vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>_>
                                  )local_50,(subscriber_info_t *)&pos);
  local_58._M_current =
       (subscriber_info_t *)
       std::
       vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
       ::end(&this->m_vector);
  bVar1 = __gnu_cxx::operator!=(&local_40,&local_58);
  bVar3 = false;
  if (bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<so_5::impl::local_mbox_details::subscriber_info_t_*,_std::vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>_>
              ::operator->(&local_40);
    paVar2 = subscriber_info_t::subscriber_pointer(this_00);
    bVar3 = paVar2 == agent;
  }
  if (bVar3) {
    iterator::iterator(__return_storage_ptr__,(vector_iterator_type)local_40._M_current);
  }
  else {
    it_v = std::
           vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
           ::end(&this->m_vector);
    iterator::iterator(__return_storage_ptr__,(vector_iterator_type)it_v._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator
	find_in_vector( agent_t * agent )
		{
			subscriber_info_t info{ agent };
			auto pos = std::lower_bound( m_vector.begin(), m_vector.end(), info );
			if( pos != m_vector.end() && pos->subscriber_pointer() == agent )
				return iterator{ pos };
			else
				return iterator{ m_vector.end() };
		}